

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O2

void __thiscall TRM::BitmapDevice::BitmapDevice(BitmapDevice *this,shared_ptr<TRM::Bitmap> *bitmap)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  value_type_conflict3 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  (this->super_Device)._vptr_Device = (_func_int **)&PTR__BitmapDevice_00120d40;
  (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  glm::detail::init_gentype<glm::mat<4,_4,_float,_(glm::qualifier)0>,_(glm::detail::genTypeEnum)1>::
  identity();
  (this->mMatrix).value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_28;
  (this->mMatrix).value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_28._4_4_;
  (this->mMatrix).value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_20;
  (this->mMatrix).value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_20._4_4_;
  (this->mMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_38;
  (this->mMatrix).value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_38._4_4_;
  (this->mMatrix).value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_30;
  (this->mMatrix).value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_30._4_4_;
  (this->mMatrix).value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_48;
  (this->mMatrix).value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_48._4_4_;
  (this->mMatrix).value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_40;
  (this->mMatrix).value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_40._4_4_;
  (this->mMatrix).value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_58;
  (this->mMatrix).value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uStack_54;
  (this->mMatrix).value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_50;
  (this->mMatrix).value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_50._4_4_;
  peVar1 = (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<float,_std::allocator<float>_>::resize
            (&this->mZBuffer,(ulong)(peVar1->fHeight * peVar1->fWidth));
  local_58 = 3.4028235e+38;
  std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (&this->mZBuffer,
             (long)(this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_58);
  return;
}

Assistant:

BitmapDevice::BitmapDevice(std::shared_ptr<Bitmap> bitmap)
    : Device(), mBitmap(std::move(bitmap)) {
  mMatrix = IdentityMatrix();
  mZBuffer.resize(mBitmap->width() * mBitmap->height());
  mZBuffer.assign(mZBuffer.size(), std::numeric_limits<float>::max());
}